

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O3

CommandOptions * write_timed_text_file(CommandOptions *Options)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  AESEncContext *pAVar12;
  HMACContext *this;
  long lVar13;
  long in_RSI;
  MyInfo *pMVar14;
  undefined8 *puVar15;
  _Self __tmp;
  _List_node_base *p_Var16;
  byte bVar17;
  FortunaRNG RNG;
  MXFWriter Writer;
  ST2052_TextParser Parser;
  string XMLDoc;
  TimedTextDescriptor TDesc;
  FrameBuffer FrameBuffer;
  byte_t IV_buf [16];
  allocator<char> local_371;
  AESEncContext *local_370;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_318 [5];
  undefined1 local_2c0 [32];
  uchar local_2a0 [16];
  byte_t local_290 [4];
  byte_t abStack_28c [4];
  byte_t abStack_288 [4];
  byte_t abStack_284 [4];
  bool local_280;
  bool bStack_27f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  undefined4 local_218;
  HMACContext *local_210;
  undefined1 local_208 [32];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _List_node_base local_1a8;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [88];
  undefined1 local_118 [24];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  bVar17 = 0;
  AS_02::TimedText::ST2052_TextParser::ST2052_TextParser((ST2052_TextParser *)(local_348 + 0x10));
  AS_02::TimedText::MXFWriter::MXFWriter((MXFWriter *)local_348);
  ASDCP::FrameBuffer::FrameBuffer((FrameBuffer *)local_170);
  local_170._56_8_ = local_170 + 0x48;
  local_170._0_8_ = &PTR__FrameBuffer_0011abe0;
  local_170._64_8_ = (char *)0x0;
  local_170[0x48] = '\0';
  local_170._40_8_ = (char *)0x0;
  local_170._48_8_ = (char *)0x0;
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor((TimedTextDescriptor *)local_208);
  AS_02::TimedText::ST2052_TextParser::OpenRead((string *)Options);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->asset_id_flag;
  iVar1._3_1_ = Options->encrypt_header_flag;
  if (iVar1 < 0) goto LAB_0010e985;
  AS_02::TimedText::ST2052_TextParser::FillTimedTextDescriptor((TimedTextDescriptor *)local_98);
  Kumu::Result_t::~Result_t(local_98);
  local_208._0_8_ = *(Rational *)(in_RSI + 0x18);
  local_208._8_4_ = *(ui32_t *)(in_RSI + 0x10);
  ASDCP::FrameBuffer::Capacity((uint)local_100);
  Kumu::Result_t::~Result_t(local_100);
  if (*(long *)(in_RSI + 0x290) != 0) {
    std::__cxx11::string::_M_assign((string *)&local_1e8);
  }
  if (*(char *)(in_RSI + 5) == '\x01') {
    fputs("IMF Timed-Text Descriptor:\n",_stderr);
    ASDCP::TimedText::DescriptorDump((TimedTextDescriptor *)local_208,(_IO_FILE *)0x0);
  }
  iVar2._0_1_ = Options->error_flag;
  iVar2._1_1_ = Options->key_flag;
  iVar2._2_1_ = Options->asset_id_flag;
  iVar2._3_1_ = Options->encrypt_header_flag;
  if (iVar2 < 0) goto LAB_0010e985;
  if (*(char *)(in_RSI + 0xc) == '\0') {
    pMVar14 = &s_MyInfo;
    puVar15 = (undefined8 *)local_2c0;
    for (lVar13 = 8; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar15 = *(undefined8 *)(pMVar14->super_WriterInfo).ProductUUID;
      pMVar14 = (MyInfo *)((long)pMVar14 + ((ulong)bVar17 * -2 + 1) * 8);
      puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
    }
    local_280 = s_MyInfo.super_WriterInfo.EncryptedEssence;
    bStack_27f = s_MyInfo.super_WriterInfo.UsesHMAC;
    local_278._M_allocated_capacity = (size_type)local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_278,s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductVersion._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductVersion._M_string_length);
    local_258[0] = local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_258,s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.CompanyName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.CompanyName._M_string_length);
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p,
               s_MyInfo.super_WriterInfo.ProductName._M_dataplus._M_p +
               s_MyInfo.super_WriterInfo.ProductName._M_string_length);
    local_218 = 2;
    if (*(char *)(in_RSI + 2) == '\x01') {
      local_2c0._16_8_ = *(size_type *)(in_RSI + 0x45);
      local_2c0._24_8_ = *(undefined8 *)(in_RSI + 0x4d);
    }
    else {
      Kumu::GenRandomUUID(local_2c0 + 0x10);
    }
    if (*(char *)(in_RSI + 1) == '\x01') {
      Kumu::FortunaRNG::FortunaRNG((FortunaRNG *)local_368);
      Kumu::GenRandomUUID(local_2a0);
      local_280 = true;
      if (*(char *)(in_RSI + 0x34) == '\x01') {
        local_290 = (byte_t  [4])*(undefined4 *)(in_RSI + 0x35);
        abStack_28c = (byte_t  [4])*(undefined4 *)(in_RSI + 0x39);
        abStack_288 = (byte_t  [4])*(undefined4 *)(in_RSI + 0x3d);
        abStack_284 = (byte_t  [4])*(undefined4 *)(in_RSI + 0x41);
      }
      else {
        local_328[8] = false;
        local_328[9] = '\0';
        local_328[10] = '\0';
        local_328[0xb] = '\0';
        local_328[0xc] = '\0';
        local_328[0xd] = '\0';
        local_328[0xe] = '\0';
        local_328[0xf] = '\0';
        aaStack_318[0]._0_1_ = '\0';
        aaStack_318[0]._1_1_ = '\0';
        aaStack_318[0]._2_1_ = '\0';
        aaStack_318[0]._3_1_ = '\0';
        aaStack_318[0]._4_1_ = '\0';
        aaStack_318[0]._5_1_ = '\0';
        aaStack_318[0]._6_1_ = '\0';
        aaStack_318[0]._7_1_ = '\0';
        aaStack_318[0]._8_1_ = '\0';
        local_328._0_8_ = &PTR__IArchive_0011aaa8;
        Kumu::GenRandomValue((UUID *)local_328);
        local_290 = (byte_t  [4])local_328._9_4_;
        abStack_28c = (byte_t  [4])stack0xfffffffffffffce5;
        abStack_288 = (byte_t  [4])aaStack_318[0]._1_4_;
        abStack_284 = (byte_t  [4])aaStack_318[0]._5_4_;
      }
      pAVar12 = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(pAVar12);
      local_370 = pAVar12;
      ASDCP::AESEncContext::InitKey(local_328);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
      Kumu::Result_t::~Result_t((Result_t *)local_328);
      iVar3._0_1_ = Options->error_flag;
      iVar3._1_1_ = Options->key_flag;
      iVar3._2_1_ = Options->asset_id_flag;
      iVar3._3_1_ = Options->encrypt_header_flag;
      if (iVar3 < 0) {
LAB_0010e6b4:
        this = (HMACContext *)0x0;
      }
      else {
        Kumu::FortunaRNG::FillRandom(local_368,(uint)local_118);
        ASDCP::AESEncContext::SetIVec(local_328);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
        Kumu::Result_t::~Result_t((Result_t *)local_328);
        iVar4._0_1_ = Options->error_flag;
        iVar4._1_1_ = Options->key_flag;
        iVar4._2_1_ = Options->asset_id_flag;
        iVar4._3_1_ = Options->encrypt_header_flag;
        if ((iVar4 < 0) || (*(char *)(in_RSI + 4) != '\x01')) goto LAB_0010e6b4;
        bStack_27f = true;
        this = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this);
        ASDCP::HMACContext::InitKey(local_328,(LabelSet_t)this);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
        Kumu::Result_t::~Result_t((Result_t *)local_328);
      }
      Kumu::FortunaRNG::~FortunaRNG((FortunaRNG *)local_368);
    }
    else {
      this = (HMACContext *)0x0;
      local_370 = (AESEncContext *)0x0;
    }
    iVar5._0_1_ = Options->error_flag;
    iVar5._1_1_ = Options->key_flag;
    iVar5._2_1_ = Options->asset_id_flag;
    iVar5._3_1_ = Options->encrypt_header_flag;
    if (-1 < iVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_368,*(char **)(in_RSI + 0x268),&local_371);
      AS_02::TimedText::MXFWriter::OpenWrite
                ((string *)local_328,(WriterInfo *)local_348,(TimedTextDescriptor *)local_368,
                 (uint)local_2c0);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_328);
      Kumu::Result_t::~Result_t((Result_t *)local_328);
      if (local_368._0_8_ != (long)local_368 + 0x10) {
        operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
      }
    }
    if (local_238[0] != local_228) {
      operator_delete(local_238[0],local_228[0] + 1);
    }
    if (local_258[0] != local_248) {
      operator_delete(local_258[0],local_248[0] + 1);
    }
    if ((long *)local_278._M_allocated_capacity != local_268) {
      operator_delete((void *)local_278._M_allocated_capacity,local_268[0] + 1);
    }
    iVar6._0_1_ = Options->error_flag;
    iVar6._1_1_ = Options->key_flag;
    iVar6._2_1_ = Options->asset_id_flag;
    iVar6._3_1_ = Options->encrypt_header_flag;
    pAVar12 = local_370;
    if (iVar6 < 0) goto LAB_0010e985;
  }
  else {
    this = (HMACContext *)0x0;
    pAVar12 = (AESEncContext *)0x0;
  }
  local_328._0_8_ = local_328 + 0x10;
  local_328[8] = false;
  local_328[9] = '\0';
  local_328[10] = '\0';
  local_328[0xb] = '\0';
  local_328[0xc] = '\0';
  local_328[0xd] = '\0';
  local_328[0xe] = '\0';
  local_328[0xf] = '\0';
  aaStack_318[0]._0_1_ = '\0';
  AS_02::TimedText::ST2052_TextParser::ReadTimedTextResource((string *)local_2c0);
  Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2c0);
  Kumu::Result_t::~Result_t((Result_t *)local_2c0);
  iVar7._0_1_ = Options->error_flag;
  iVar7._1_1_ = Options->key_flag;
  iVar7._2_1_ = Options->asset_id_flag;
  iVar7._3_1_ = Options->encrypt_header_flag;
  if (-1 < iVar7) {
    AS_02::TimedText::MXFWriter::WriteTimedTextResource
              ((string *)local_2c0,(AESEncContext *)local_348,(HMACContext *)local_328);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2c0);
    Kumu::Result_t::~Result_t((Result_t *)local_2c0);
  }
  local_370 = pAVar12;
  local_210 = this;
  if (local_1a8._M_next != &local_1a8) {
    p_Var16 = local_1a8._M_next;
    do {
      iVar8._0_1_ = Options->error_flag;
      iVar8._1_1_ = Options->key_flag;
      iVar8._2_1_ = Options->asset_id_flag;
      iVar8._3_1_ = Options->encrypt_header_flag;
      if (iVar8 < 0) goto LAB_0010e969;
      local_368[8] = 1;
      local_368._9_7_ = SUB87(p_Var16[1]._M_next,0);
      local_368[0x10] = (byte_t)((ulong)p_Var16[1]._M_next >> 0x38);
      local_368._17_7_ = SUB87(p_Var16[1]._M_prev,0);
      local_368[0x18] = (byte_t)((ulong)p_Var16[1]._M_prev >> 0x38);
      local_368._0_8_ = &PTR__IArchive_0011aaa8;
      AS_02::TimedText::ST2052_TextParser::ReadAncillaryResource
                ((UUID *)local_2c0,(FrameBuffer *)(local_348 + 0x10),(IResourceResolver *)local_368)
      ;
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2c0);
      Kumu::Result_t::~Result_t((Result_t *)local_2c0);
      iVar9._0_1_ = Options->error_flag;
      iVar9._1_1_ = Options->key_flag;
      iVar9._2_1_ = Options->asset_id_flag;
      iVar9._3_1_ = Options->encrypt_header_flag;
      if (-1 < iVar9) {
        if (*(char *)(in_RSI + 5) == '\x01') {
          ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)local_170,(uint)_stderr);
        }
        if (*(char *)(in_RSI + 0xc) == '\0') {
          AS_02::TimedText::MXFWriter::WriteAncillaryResource
                    ((FrameBuffer *)local_2c0,(AESEncContext *)local_348,(HMACContext *)local_170);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2c0);
          Kumu::Result_t::~Result_t((Result_t *)local_2c0);
        }
      }
      iVar10._0_1_ = Options->error_flag;
      iVar10._1_1_ = Options->key_flag;
      iVar10._2_1_ = Options->asset_id_flag;
      iVar10._3_1_ = Options->encrypt_header_flag;
      if (iVar10 == Kumu::RESULT_ENDOFFILE) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
      }
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != &local_1a8);
  }
  iVar11._0_1_ = Options->error_flag;
  iVar11._1_1_ = Options->key_flag;
  iVar11._2_1_ = Options->asset_id_flag;
  iVar11._3_1_ = Options->encrypt_header_flag;
  if ((-1 < iVar11) && (*(char *)(in_RSI + 0xc) == '\0')) {
    AS_02::TimedText::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_2c0);
    Kumu::Result_t::~Result_t((Result_t *)local_2c0);
  }
LAB_0010e969:
  if ((undefined1 *)local_328._0_8_ != local_328 + 0x10) {
    operator_delete((void *)local_328._0_8_,
                    CONCAT35(aaStack_318[0]._M_allocated_capacity._5_3_,
                             CONCAT41(aaStack_318[0]._M_allocated_capacity._1_4_,
                                      aaStack_318[0]._M_local_buf[0])) + 1);
  }
LAB_0010e985:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
  }
  while (local_1a8._M_next != &local_1a8) {
    p_Var16 = (local_1a8._M_next)->_M_next;
    operator_delete(local_1a8._M_next,0x28);
    local_1a8._M_next = p_Var16;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  ASDCP::TimedText::FrameBuffer::~FrameBuffer((FrameBuffer *)local_170);
  AS_02::TimedText::MXFWriter::~MXFWriter((MXFWriter *)local_348);
  AS_02::TimedText::ST2052_TextParser::~ST2052_TextParser((ST2052_TextParser *)(local_348 + 0x10));
  return Options;
}

Assistant:

Result_t
write_timed_text_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  AS_02::TimedText::ST2052_TextParser  Parser;
  AS_02::TimedText::MXFWriter    Writer;
  TimedText::FrameBuffer  FrameBuffer;
  TimedText::TimedTextDescriptor TDesc;
  byte_t            IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillTimedTextDescriptor(TDesc);
      TDesc.EditRate = Options.edit_rate;
      TDesc.ContainerDuration = Options.duration;
      FrameBuffer.Capacity(Options.fb_size);

      if ( ! Options.profile_name.empty() )
	{
	  TDesc.NamespaceName = Options.profile_name;
	}

      if ( Options.verbose_flag )
	{
	  fputs("IMF Timed-Text Descriptor:\n", stderr);
	  TimedText::DescriptorDump(TDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file.c_str(), Info, TDesc);
    }

  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  TimedText::ResourceList_t::const_iterator ri;

  result = Parser.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    result = Writer.WriteTimedTextResource(XMLDoc, Context, HMAC);

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Parser.ReadAncillaryResource((*ri).ResourceID, FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);

	  if ( ! Options.no_write_flag )
	    {
	      result = Writer.WriteAncillaryResource(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}